

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r6p_1lin.cpp
# Opt level: O1

vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
* solve_xy_from_AM(vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   *__return_storage_ptr__,double *z,int nroots,MatrixXd *AM)

{
  iterator __position;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  int j;
  long lVar8;
  undefined8 *puVar9;
  double *pdVar10;
  double *pdVar11;
  ulong uVar12;
  Index IVar13;
  Index index_1;
  long lVar14;
  ulong uVar15;
  double *pdVar16;
  double *pdVar17;
  long lVar18;
  void *pvVar19;
  MatrixXd AMs;
  MatrixXd AA;
  VectorXd s;
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  double zi [8];
  DenseStorage<double,__1,__1,__1,_0> local_358;
  double *local_338;
  ulong local_330;
  assign_op<double,_double> local_319;
  double local_318;
  undefined8 uStack_310;
  DenseStorage<double,__1,__1,__1,_0> local_308;
  PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *local_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  ulong local_2d8;
  double local_2c8;
  undefined8 uStack_2c0;
  double local_2b8;
  undefined8 uStack_2b0;
  void *local_2a8;
  undefined8 uStack_2a0;
  double local_298;
  undefined8 uStack_290;
  vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>> *local_280
  ;
  long local_278;
  long local_270;
  generic_dense_assignment_kernel<_d44aba81_> local_268;
  ulong local_248;
  double *local_240;
  ulong local_238;
  undefined1 local_230 [16];
  ulong local_220;
  undefined1 local_218 [136];
  double local_190;
  double *local_180;
  void *local_170;
  double local_160;
  double *local_150;
  void *local_140;
  double local_130;
  double *local_120;
  void *local_110;
  double local_100;
  double *local_f0;
  void *local_e0;
  double local_d0;
  double *local_c0;
  void *local_b0;
  undefined8 local_a0;
  double *local_90;
  void *local_80;
  void *local_78;
  double local_70 [8];
  
  local_358.m_data = (double *)0x0;
  local_358.m_rows = 0;
  local_358.m_cols = 0;
  local_240 = z;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_358,0x540,0x15,0x40);
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pdVar10 = (AM->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  lVar8 = (AM->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  lVar14 = 0;
  pdVar11 = local_358.m_data;
  do {
    if (0 < local_358.m_cols) {
      pdVar16 = pdVar10 + (int)(&DAT_0067f900)[lVar14];
      IVar13 = local_358.m_cols;
      pdVar17 = pdVar11;
      do {
        *pdVar17 = *pdVar16;
        pdVar16 = pdVar16 + lVar8;
        pdVar17 = pdVar17 + local_358.m_rows;
        IVar13 = IVar13 + -1;
      } while (IVar13 != 0);
    }
    lVar14 = lVar14 + 1;
    pdVar11 = pdVar11 + 1;
  } while (lVar14 != 0x15);
  if (0 < nroots) {
    local_248 = (ulong)(uint)nroots;
    uVar12 = 0;
    local_280 = (vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                 *)__return_storage_ptr__;
    do {
      local_78 = (void *)local_240[uVar12];
      lVar8 = 1;
      pvVar19 = local_78;
      do {
        pvVar19 = (void *)((double)pvVar19 * (double)local_78);
        local_70[lVar8 + -1] = (double)pvVar19;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 8);
      local_218._0_8_ = 0x15;
      local_218._8_8_ = 0x15;
      local_218._16_8_ = 0;
      local_238 = uVar12;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_338,
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)local_218);
      local_218._0_8_ = local_358.m_data + local_358.m_rows * 5;
      local_218._8_8_ = local_358.m_rows;
      local_218._32_8_ = 0;
      local_218._40_8_ = 5;
      local_218._48_8_ = local_358.m_rows;
      local_308.m_data = local_338;
      local_308.m_rows = local_330;
      local_2e8 = 0;
      uStack_2e0 = 0;
      local_2d8 = local_330;
      local_2f0 = (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_338;
      local_218._24_8_ = &local_358;
      Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>::
      operator=((MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1> *)
                &local_308,
                (MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1> *)
                local_218);
      local_218._0_8_ = local_358.m_data + local_358.m_rows * 6;
      local_218._8_8_ = local_358.m_rows;
      local_218._32_8_ = 0;
      local_218._40_8_ = 6;
      local_218._48_8_ = local_358.m_rows;
      local_308.m_data = local_338 + local_330;
      local_308.m_rows = local_330;
      local_2e8 = 0;
      uStack_2e0 = 1;
      local_2d8 = local_330;
      local_2f0 = (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_338;
      local_218._24_8_ = &local_358;
      Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>::
      operator=((MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1> *)
                &local_308,
                (MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1> *)
                local_218);
      local_218._0_8_ = local_358.m_data + local_358.m_rows * 9;
      local_218._8_8_ = local_358.m_rows;
      local_218._32_8_ = 0;
      local_218._40_8_ = 9;
      local_218._48_8_ = local_358.m_rows;
      local_308.m_data = local_338 + local_330 * 2;
      local_308.m_rows = local_330;
      local_2e8 = 0;
      uStack_2e0 = 2;
      local_2d8 = local_330;
      local_2f0 = (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_338;
      local_218._24_8_ = &local_358;
      Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>::
      operator=((MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1> *)
                &local_308,
                (MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1> *)
                local_218);
      local_218._0_8_ = local_358.m_data + local_358.m_rows * 0xf;
      local_218._8_8_ = local_358.m_rows;
      local_218._32_8_ = 0;
      local_218._40_8_ = 0xf;
      local_218._48_8_ = local_358.m_rows;
      local_308.m_data = local_338 + local_330 * 3;
      local_308.m_rows = local_330;
      local_2e8 = 0;
      uStack_2e0 = 3;
      local_2d8 = local_330;
      local_2f0 = (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_338;
      local_218._24_8_ = &local_358;
      Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>::
      operator=((MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1> *)
                &local_308,
                (MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1> *)
                local_218);
      local_218._0_8_ = local_358.m_data + local_358.m_rows * 0x1a;
      local_218._8_8_ = local_358.m_rows;
      local_218._32_8_ = 0;
      local_218._40_8_ = 0x1a;
      local_218._48_8_ = local_358.m_rows;
      local_308.m_data = local_338 + local_330 * 4;
      local_308.m_rows = local_330;
      local_2e8 = 0;
      uStack_2e0 = 4;
      local_2d8 = local_330;
      local_2f0 = (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_338;
      local_218._24_8_ = &local_358;
      Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>::
      operator=((MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1> *)
                &local_308,
                (MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1> *)
                local_218);
      local_218._0_8_ = local_358.m_data + local_358.m_rows * 0x2b;
      local_218._8_8_ = local_358.m_rows;
      local_218._32_8_ = 0;
      local_218._40_8_ = (void *)0x2b;
      local_218._48_8_ = local_358.m_rows;
      local_308.m_data = local_338 + local_330 * 5;
      local_308.m_rows = local_330;
      local_2e8 = 0;
      uStack_2e0 = 5;
      local_2d8 = local_330;
      local_2f0 = (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_338;
      local_218._24_8_ = &local_358;
      Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>::
      operator=((MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1> *)
                &local_308,
                (MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1> *)
                local_218);
      dVar7 = local_70[4];
      pdVar10 = local_338 + local_330 * 6;
      uVar12 = local_330;
      if ((((ulong)pdVar10 & 7) == 0) &&
         (uVar12 = (ulong)((uint)((ulong)pdVar10 >> 3) & 1), (long)local_330 <= (long)uVar12)) {
        uVar12 = local_330;
      }
      if (0 < (long)uVar12) {
        uVar15 = 0;
        do {
          pdVar10[uVar15] =
               local_358.m_data[local_358.m_rows * 7 + uVar15] * (double)local_78 +
               local_358.m_data[local_358.m_rows * 4 + uVar15];
          uVar15 = uVar15 + 1;
        } while (uVar12 != uVar15);
      }
      lVar8 = local_330 - uVar12;
      uVar15 = (lVar8 - (lVar8 >> 0x3f) & 0xfffffffffffffffeU) + uVar12;
      if (1 < lVar8) {
        do {
          dVar1 = (local_358.m_data + local_358.m_rows * 4 + uVar12)[1];
          dVar2 = (local_358.m_data + local_358.m_rows * 7 + uVar12)[1];
          pdVar10[uVar12] =
               local_358.m_data[local_358.m_rows * 7 + uVar12] * (double)local_78 +
               local_358.m_data[local_358.m_rows * 4 + uVar12];
          (pdVar10 + uVar12)[1] = dVar2 * (double)local_78 + dVar1;
          uVar12 = uVar12 + 2;
        } while ((long)uVar12 < (long)uVar15);
      }
      if ((long)uVar15 < (long)local_330) {
        do {
          pdVar10[uVar15] =
               local_358.m_data[local_358.m_rows * 7 + uVar15] * (double)local_78 +
               local_358.m_data[local_358.m_rows * 4 + uVar15];
          uVar15 = uVar15 + 1;
        } while (local_330 != uVar15);
      }
      pdVar10 = local_338 + local_330 * 7;
      uVar12 = local_330;
      if ((((ulong)pdVar10 & 7) == 0) &&
         (uVar12 = (ulong)((uint)((ulong)pdVar10 >> 3) & 1), (long)local_330 <= (long)uVar12)) {
        uVar12 = local_330;
      }
      if (0 < (long)uVar12) {
        uVar15 = 0;
        do {
          pdVar10[uVar15] =
               local_358.m_data[local_358.m_rows * 10 + uVar15] * (double)local_78 +
               local_358.m_data[local_358.m_rows * 8 + uVar15];
          uVar15 = uVar15 + 1;
        } while (uVar12 != uVar15);
      }
      lVar8 = local_330 - uVar12;
      uVar15 = (lVar8 - (lVar8 >> 0x3f) & 0xfffffffffffffffeU) + uVar12;
      if (1 < lVar8) {
        do {
          dVar1 = (local_358.m_data + local_358.m_rows * 8 + uVar12)[1];
          dVar2 = (local_358.m_data + local_358.m_rows * 10 + uVar12)[1];
          pdVar10[uVar12] =
               local_358.m_data[local_358.m_rows * 10 + uVar12] * (double)local_78 +
               local_358.m_data[local_358.m_rows * 8 + uVar12];
          (pdVar10 + uVar12)[1] = dVar2 * (double)local_78 + dVar1;
          uVar12 = uVar12 + 2;
        } while ((long)uVar12 < (long)uVar15);
      }
      if ((long)uVar15 < (long)local_330) {
        do {
          pdVar10[uVar15] =
               local_358.m_data[local_358.m_rows * 10 + uVar15] * (double)local_78 +
               local_358.m_data[local_358.m_rows * 8 + uVar15];
          uVar15 = uVar15 + 1;
        } while (local_330 != uVar15);
      }
      pdVar10 = local_338 + local_330 * 8;
      uVar12 = local_330;
      if ((((ulong)pdVar10 & 7) == 0) &&
         (uVar12 = (ulong)((uint)((ulong)pdVar10 >> 3) & 1), (long)local_330 <= (long)uVar12)) {
        uVar12 = local_330;
      }
      if (0 < (long)uVar12) {
        uVar15 = 0;
        do {
          pdVar10[uVar15] =
               local_358.m_data[local_358.m_rows * 0x10 + uVar15] * (double)local_78 +
               local_358.m_data[local_358.m_rows * 0xe + uVar15];
          uVar15 = uVar15 + 1;
        } while (uVar12 != uVar15);
      }
      lVar8 = local_330 - uVar12;
      uVar15 = (lVar8 - (lVar8 >> 0x3f) & 0xfffffffffffffffeU) + uVar12;
      if (1 < lVar8) {
        do {
          dVar1 = (local_358.m_data + local_358.m_rows * 0xe + uVar12)[1];
          dVar2 = (local_358.m_data + local_358.m_rows * 0x10 + uVar12)[1];
          pdVar10[uVar12] =
               local_358.m_data[local_358.m_rows * 0x10 + uVar12] * (double)local_78 +
               local_358.m_data[local_358.m_rows * 0xe + uVar12];
          (pdVar10 + uVar12)[1] = dVar2 * (double)local_78 + dVar1;
          uVar12 = uVar12 + 2;
        } while ((long)uVar12 < (long)uVar15);
      }
      if ((long)uVar15 < (long)local_330) {
        do {
          pdVar10[uVar15] =
               local_358.m_data[local_358.m_rows * 0x10 + uVar15] * (double)local_78 +
               local_358.m_data[local_358.m_rows * 0xe + uVar15];
          uVar15 = uVar15 + 1;
        } while (local_330 != uVar15);
      }
      pdVar10 = local_338 + local_330 * 9;
      uVar12 = local_330;
      if ((((ulong)pdVar10 & 7) == 0) &&
         (uVar12 = (ulong)((uint)((ulong)pdVar10 >> 3) & 1), (long)local_330 <= (long)uVar12)) {
        uVar12 = local_330;
      }
      if (0 < (long)uVar12) {
        uVar15 = 0;
        do {
          pdVar10[uVar15] =
               local_358.m_data[local_358.m_rows * 0x1b + uVar15] * (double)local_78 +
               local_358.m_data[local_358.m_rows * 0x19 + uVar15];
          uVar15 = uVar15 + 1;
        } while (uVar12 != uVar15);
      }
      lVar8 = local_330 - uVar12;
      uVar15 = (lVar8 - (lVar8 >> 0x3f) & 0xfffffffffffffffeU) + uVar12;
      if (1 < lVar8) {
        do {
          dVar1 = (local_358.m_data + local_358.m_rows * 0x19 + uVar12)[1];
          dVar2 = (local_358.m_data + local_358.m_rows * 0x1b + uVar12)[1];
          pdVar10[uVar12] =
               local_358.m_data[local_358.m_rows * 0x1b + uVar12] * (double)local_78 +
               local_358.m_data[local_358.m_rows * 0x19 + uVar12];
          (pdVar10 + uVar12)[1] = dVar2 * (double)local_78 + dVar1;
          uVar12 = uVar12 + 2;
        } while ((long)uVar12 < (long)uVar15);
      }
      if ((long)uVar15 < (long)local_330) {
        do {
          pdVar10[uVar15] =
               local_358.m_data[local_358.m_rows * 0x1b + uVar15] * (double)local_78 +
               local_358.m_data[local_358.m_rows * 0x19 + uVar15];
          uVar15 = uVar15 + 1;
        } while (local_330 != uVar15);
      }
      pdVar10 = local_338 + local_330 * 10;
      uVar12 = local_330;
      if ((((ulong)pdVar10 & 7) == 0) &&
         (uVar12 = (ulong)((uint)((ulong)pdVar10 >> 3) & 1), (long)local_330 <= (long)uVar12)) {
        uVar12 = local_330;
      }
      if (0 < (long)uVar12) {
        uVar15 = 0;
        do {
          pdVar10[uVar15] =
               local_358.m_data[local_358.m_rows * 0x2c + uVar15] * (double)local_78 +
               local_358.m_data[local_358.m_rows * 0x2a + uVar15];
          uVar15 = uVar15 + 1;
        } while (uVar12 != uVar15);
      }
      lVar8 = local_330 - uVar12;
      uVar15 = (lVar8 - (lVar8 >> 0x3f) & 0xfffffffffffffffeU) + uVar12;
      if (1 < lVar8) {
        do {
          dVar1 = (local_358.m_data + local_358.m_rows * 0x2a + uVar12)[1];
          dVar2 = (local_358.m_data + local_358.m_rows * 0x2c + uVar12)[1];
          pdVar10[uVar12] =
               local_358.m_data[local_358.m_rows * 0x2c + uVar12] * (double)local_78 +
               local_358.m_data[local_358.m_rows * 0x2a + uVar12];
          (pdVar10 + uVar12)[1] = dVar2 * (double)local_78 + dVar1;
          uVar12 = uVar12 + 2;
        } while ((long)uVar12 < (long)uVar15);
      }
      if ((long)uVar15 < (long)local_330) {
        do {
          pdVar10[uVar15] =
               local_358.m_data[local_358.m_rows * 0x2c + uVar15] * (double)local_78 +
               local_358.m_data[local_358.m_rows * 0x2a + uVar15];
          uVar15 = uVar15 + 1;
        } while (local_330 != uVar15);
      }
      pdVar10 = local_338 + local_330 * 0xb;
      uVar12 = local_330;
      if ((((ulong)pdVar10 & 7) == 0) &&
         (uVar12 = (ulong)((uint)((ulong)pdVar10 >> 3) & 1), (long)local_330 <= (long)uVar12)) {
        uVar12 = local_330;
      }
      if (0 < (long)uVar12) {
        uVar15 = 0;
        do {
          pdVar10[uVar15] =
               local_358.m_data[local_358.m_rows * 0xc + uVar15] * local_70[0] +
               local_358.m_data[local_358.m_rows * 0xb + uVar15] * (double)local_78 +
               local_358.m_data[local_358.m_rows * 3 + uVar15];
          uVar15 = uVar15 + 1;
        } while (uVar12 != uVar15);
      }
      lVar14 = local_330 - uVar12;
      lVar8 = uVar12 + (lVar14 - (lVar14 >> 0x3f) & 0xfffffffffffffffeU);
      uVar15 = uVar12;
      if (1 < lVar14) {
        do {
          dVar1 = (local_358.m_data + local_358.m_rows * 3 + uVar15)[1];
          dVar2 = (local_358.m_data + local_358.m_rows * 0xb + uVar15)[1];
          dVar3 = (local_358.m_data + local_358.m_rows * 0xc + uVar15)[1];
          pdVar10[uVar15] =
               local_358.m_data[local_358.m_rows * 0xc + uVar15] * local_70[0] +
               local_358.m_data[local_358.m_rows * 0xb + uVar15] * (double)local_78 +
               local_358.m_data[local_358.m_rows * 3 + uVar15];
          (pdVar10 + uVar15)[1] = dVar3 * local_70[0] + dVar2 * (double)local_78 + dVar1;
          uVar15 = uVar15 + 2;
        } while ((long)uVar15 < lVar8);
      }
      if (lVar8 < (long)local_330) {
        lVar18 = lVar14 / 2;
        lVar8 = 0;
        do {
          local_338[uVar12 + lVar18 * 2 + local_330 * 0xb + lVar8] =
               local_358.m_data[uVar12 + lVar18 * 2 + local_358.m_rows * 0xc + lVar8] * local_70[0]
               + local_358.m_data[uVar12 + lVar18 * 2 + local_358.m_rows * 0xb + lVar8] *
                 (double)local_78 +
                 local_358.m_data[uVar12 + lVar18 * 2 + local_358.m_rows * 3 + lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar14 % 2 != lVar8);
      }
      pdVar10 = local_338 + local_330 * 0xc;
      uVar12 = local_330;
      if ((((ulong)pdVar10 & 7) == 0) &&
         (uVar12 = (ulong)((uint)((ulong)pdVar10 >> 3) & 1), (long)local_330 <= (long)uVar12)) {
        uVar12 = local_330;
      }
      if (0 < (long)uVar12) {
        uVar15 = 0;
        do {
          pdVar10[uVar15] =
               local_358.m_data[local_358.m_rows * 0x12 + uVar15] * local_70[0] +
               local_358.m_data[local_358.m_rows * 0x11 + uVar15] * (double)local_78 +
               local_358.m_data[local_358.m_rows * 0xd + uVar15];
          uVar15 = uVar15 + 1;
        } while (uVar12 != uVar15);
      }
      lVar14 = local_330 - uVar12;
      lVar8 = uVar12 + (lVar14 - (lVar14 >> 0x3f) & 0xfffffffffffffffeU);
      uVar15 = uVar12;
      if (1 < lVar14) {
        do {
          dVar1 = (local_358.m_data + local_358.m_rows * 0xd + uVar15)[1];
          dVar2 = (local_358.m_data + local_358.m_rows * 0x11 + uVar15)[1];
          dVar3 = (local_358.m_data + local_358.m_rows * 0x12 + uVar15)[1];
          pdVar10[uVar15] =
               local_358.m_data[local_358.m_rows * 0x12 + uVar15] * local_70[0] +
               local_358.m_data[local_358.m_rows * 0x11 + uVar15] * (double)local_78 +
               local_358.m_data[local_358.m_rows * 0xd + uVar15];
          (pdVar10 + uVar15)[1] = dVar3 * local_70[0] + dVar2 * (double)local_78 + dVar1;
          uVar15 = uVar15 + 2;
        } while ((long)uVar15 < lVar8);
      }
      if (lVar8 < (long)local_330) {
        lVar18 = lVar14 / 2;
        lVar8 = 0;
        do {
          local_338[uVar12 + lVar18 * 2 + local_330 * 0xc + lVar8] =
               local_358.m_data[uVar12 + lVar18 * 2 + local_358.m_rows * 0x12 + lVar8] * local_70[0]
               + local_358.m_data[uVar12 + lVar18 * 2 + local_358.m_rows * 0x11 + lVar8] *
                 (double)local_78 +
                 local_358.m_data[uVar12 + lVar18 * 2 + local_358.m_rows * 0xd + lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar14 % 2 != lVar8);
      }
      pdVar10 = local_338 + local_330 * 0xd;
      uVar12 = local_330;
      if ((((ulong)pdVar10 & 7) == 0) &&
         (uVar12 = (ulong)((uint)((ulong)pdVar10 >> 3) & 1), (long)local_330 <= (long)uVar12)) {
        uVar12 = local_330;
      }
      if (0 < (long)uVar12) {
        uVar15 = 0;
        do {
          pdVar10[uVar15] =
               local_358.m_data[local_358.m_rows * 0x1d + uVar15] * local_70[0] +
               local_358.m_data[local_358.m_rows * 0x1c + uVar15] * (double)local_78 +
               local_358.m_data[local_358.m_rows * 0x18 + uVar15];
          uVar15 = uVar15 + 1;
        } while (uVar12 != uVar15);
      }
      lVar14 = local_330 - uVar12;
      lVar8 = uVar12 + (lVar14 - (lVar14 >> 0x3f) & 0xfffffffffffffffeU);
      uVar15 = uVar12;
      if (1 < lVar14) {
        do {
          dVar1 = (local_358.m_data + local_358.m_rows * 0x18 + uVar15)[1];
          dVar2 = (local_358.m_data + local_358.m_rows * 0x1c + uVar15)[1];
          dVar3 = (local_358.m_data + local_358.m_rows * 0x1d + uVar15)[1];
          pdVar10[uVar15] =
               local_358.m_data[local_358.m_rows * 0x1d + uVar15] * local_70[0] +
               local_358.m_data[local_358.m_rows * 0x1c + uVar15] * (double)local_78 +
               local_358.m_data[local_358.m_rows * 0x18 + uVar15];
          (pdVar10 + uVar15)[1] = dVar3 * local_70[0] + dVar2 * (double)local_78 + dVar1;
          uVar15 = uVar15 + 2;
        } while ((long)uVar15 < lVar8);
      }
      if (lVar8 < (long)local_330) {
        lVar18 = lVar14 / 2;
        lVar8 = 0;
        do {
          local_338[uVar12 + lVar18 * 2 + local_330 * 0xd + lVar8] =
               local_358.m_data[uVar12 + lVar18 * 2 + local_358.m_rows * 0x1d + lVar8] * local_70[0]
               + local_358.m_data[uVar12 + lVar18 * 2 + local_358.m_rows * 0x1c + lVar8] *
                 (double)local_78 +
                 local_358.m_data[uVar12 + lVar18 * 2 + local_358.m_rows * 0x18 + lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar14 % 2 != lVar8);
      }
      pdVar10 = local_338 + local_330 * 0xe;
      uVar12 = local_330;
      if ((((ulong)pdVar10 & 7) == 0) &&
         (uVar12 = (ulong)((uint)((ulong)pdVar10 >> 3) & 1), (long)local_330 <= (long)uVar12)) {
        uVar12 = local_330;
      }
      if (0 < (long)uVar12) {
        uVar15 = 0;
        do {
          pdVar10[uVar15] =
               local_358.m_data[local_358.m_rows * 0x2f + uVar15] * local_70[1] +
               local_358.m_data[local_358.m_rows * 0x2e + uVar15] * local_70[0] +
               local_358.m_data[local_358.m_rows * 0x2d + uVar15] * (double)local_78 +
               local_358.m_data[local_358.m_rows * 0x29 + uVar15];
          uVar15 = uVar15 + 1;
        } while (uVar12 != uVar15);
      }
      lVar14 = local_330 - uVar12;
      lVar8 = (lVar14 - (lVar14 >> 0x3f) & 0xfffffffffffffffeU) + uVar12;
      uVar15 = uVar12;
      if (1 < lVar14) {
        do {
          dVar1 = (local_358.m_data + local_358.m_rows * 0x29 + uVar15)[1];
          dVar2 = (local_358.m_data + local_358.m_rows * 0x2d + uVar15)[1];
          dVar3 = (local_358.m_data + local_358.m_rows * 0x2e + uVar15)[1];
          dVar4 = (local_358.m_data + local_358.m_rows * 0x2f + uVar15)[1];
          pdVar10[uVar15] =
               local_358.m_data[local_358.m_rows * 0x2f + uVar15] * local_70[1] +
               local_358.m_data[local_358.m_rows * 0x2e + uVar15] * local_70[0] +
               local_358.m_data[local_358.m_rows * 0x2d + uVar15] * (double)local_78 +
               local_358.m_data[local_358.m_rows * 0x29 + uVar15];
          (pdVar10 + uVar15)[1] =
               dVar4 * local_70[1] + dVar3 * local_70[0] + dVar2 * (double)local_78 + dVar1;
          uVar15 = uVar15 + 2;
        } while ((long)uVar15 < lVar8);
      }
      if (lVar8 < (long)local_330) {
        lVar18 = lVar14 / 2;
        lVar8 = 0;
        do {
          local_338[uVar12 + lVar18 * 2 + local_330 * 0xe + lVar8] =
               local_358.m_data[uVar12 + lVar18 * 2 + local_358.m_rows * 0x2f + lVar8] * local_70[1]
               + local_358.m_data[uVar12 + lVar18 * 2 + local_358.m_rows * 0x2e + lVar8] *
                 local_70[0] +
                 local_358.m_data[uVar12 + lVar18 * 2 + local_358.m_rows * 0x2d + lVar8] *
                 (double)local_78 +
                 local_358.m_data[uVar12 + lVar18 * 2 + local_358.m_rows * 0x29 + lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar14 % 2 != lVar8);
      }
      pdVar10 = local_338 + local_330 * 0xf;
      uVar12 = local_330;
      if ((((ulong)pdVar10 & 7) == 0) &&
         (uVar12 = (ulong)((uint)((ulong)pdVar10 >> 3) & 1), (long)local_330 <= (long)uVar12)) {
        uVar12 = local_330;
      }
      if (0 < (long)uVar12) {
        uVar15 = 0;
        do {
          pdVar10[uVar15] =
               local_358.m_data[local_358.m_rows * 0x16 + uVar15] * local_70[2] +
               local_358.m_data[local_358.m_rows * 0x15 + uVar15] * local_70[1] +
               local_358.m_data[local_358.m_rows * 0x14 + uVar15] * local_70[0] +
               local_358.m_data[local_358.m_rows * 0x13 + uVar15] * (double)local_78 +
               local_358.m_data[local_358.m_rows * 2 + uVar15];
          uVar15 = uVar15 + 1;
        } while (uVar12 != uVar15);
      }
      lVar14 = local_330 - uVar12;
      lVar8 = (lVar14 - (lVar14 >> 0x3f) & 0xfffffffffffffffeU) + uVar12;
      uVar15 = uVar12;
      if (1 < lVar14) {
        do {
          dVar1 = (local_358.m_data + local_358.m_rows * 2 + uVar15)[1];
          dVar2 = (local_358.m_data + local_358.m_rows * 0x13 + uVar15)[1];
          dVar3 = (local_358.m_data + local_358.m_rows * 0x14 + uVar15)[1];
          dVar4 = (local_358.m_data + local_358.m_rows * 0x15 + uVar15)[1];
          dVar5 = (local_358.m_data + local_358.m_rows * 0x16 + uVar15)[1];
          pdVar10[uVar15] =
               local_358.m_data[local_358.m_rows * 0x16 + uVar15] * local_70[2] +
               local_358.m_data[local_358.m_rows * 0x15 + uVar15] * local_70[1] +
               local_358.m_data[local_358.m_rows * 0x14 + uVar15] * local_70[0] +
               local_358.m_data[local_358.m_rows * 0x13 + uVar15] * (double)local_78 +
               local_358.m_data[local_358.m_rows * 2 + uVar15];
          (pdVar10 + uVar15)[1] =
               dVar5 * local_70[2] +
               dVar4 * local_70[1] + dVar3 * local_70[0] + dVar2 * (double)local_78 + dVar1;
          uVar15 = uVar15 + 2;
        } while ((long)uVar15 < lVar8);
      }
      if (lVar8 < (long)local_330) {
        lVar18 = lVar14 / 2;
        lVar8 = 0;
        do {
          local_338[uVar12 + lVar18 * 2 + local_330 * 0xf + lVar8] =
               local_358.m_data[uVar12 + lVar18 * 2 + local_358.m_rows * 0x16 + lVar8] * local_70[2]
               + local_358.m_data[uVar12 + lVar18 * 2 + local_358.m_rows * 0x15 + lVar8] *
                 local_70[1] +
                 local_358.m_data[uVar12 + lVar18 * 2 + local_358.m_rows * 0x14 + lVar8] *
                 local_70[0] +
                 local_358.m_data[uVar12 + lVar18 * 2 + local_358.m_rows * 0x13 + lVar8] *
                 (double)local_78 +
                 local_358.m_data[uVar12 + lVar18 * 2 + local_358.m_rows * 2 + lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar14 % 2 != lVar8);
      }
      pdVar10 = local_338 + local_330 * 0x10;
      uVar12 = local_330;
      if ((((ulong)pdVar10 & 7) == 0) &&
         (uVar12 = (ulong)((uint)((ulong)pdVar10 >> 3) & 1), (long)local_330 <= (long)uVar12)) {
        uVar12 = local_330;
      }
      if (0 < (long)uVar12) {
        uVar15 = 0;
        do {
          pdVar10[uVar15] =
               local_358.m_data[local_358.m_rows * 0x21 + uVar15] * local_70[2] +
               local_358.m_data[local_358.m_rows * 0x20 + uVar15] * local_70[1] +
               local_358.m_data[local_358.m_rows * 0x1f + uVar15] * local_70[0] +
               local_358.m_data[local_358.m_rows * 0x1e + uVar15] * (double)local_78 +
               local_358.m_data[local_358.m_rows * 0x17 + uVar15];
          uVar15 = uVar15 + 1;
        } while (uVar12 != uVar15);
      }
      lVar14 = local_330 - uVar12;
      lVar8 = (lVar14 - (lVar14 >> 0x3f) & 0xfffffffffffffffeU) + uVar12;
      uVar15 = uVar12;
      if (1 < lVar14) {
        do {
          dVar1 = (local_358.m_data + local_358.m_rows * 0x17 + uVar15)[1];
          dVar2 = (local_358.m_data + local_358.m_rows * 0x1e + uVar15)[1];
          dVar3 = (local_358.m_data + local_358.m_rows * 0x1f + uVar15)[1];
          dVar4 = (local_358.m_data + local_358.m_rows * 0x20 + uVar15)[1];
          dVar5 = (local_358.m_data + local_358.m_rows * 0x21 + uVar15)[1];
          pdVar10[uVar15] =
               local_358.m_data[local_358.m_rows * 0x21 + uVar15] * local_70[2] +
               local_358.m_data[local_358.m_rows * 0x20 + uVar15] * local_70[1] +
               local_358.m_data[local_358.m_rows * 0x1f + uVar15] * local_70[0] +
               local_358.m_data[local_358.m_rows * 0x1e + uVar15] * (double)local_78 +
               local_358.m_data[local_358.m_rows * 0x17 + uVar15];
          (pdVar10 + uVar15)[1] =
               dVar5 * local_70[2] +
               dVar4 * local_70[1] + dVar3 * local_70[0] + dVar2 * (double)local_78 + dVar1;
          uVar15 = uVar15 + 2;
        } while ((long)uVar15 < lVar8);
      }
      if (lVar8 < (long)local_330) {
        lVar18 = lVar14 / 2;
        lVar8 = 0;
        do {
          local_338[uVar12 + lVar18 * 2 + local_330 * 0x10 + lVar8] =
               local_358.m_data[uVar12 + lVar18 * 2 + local_358.m_rows * 0x21 + lVar8] * local_70[2]
               + local_358.m_data[uVar12 + lVar18 * 2 + local_358.m_rows * 0x20 + lVar8] *
                 local_70[1] +
                 local_358.m_data[uVar12 + lVar18 * 2 + local_358.m_rows * 0x1f + lVar8] *
                 local_70[0] +
                 local_358.m_data[uVar12 + lVar18 * 2 + local_358.m_rows * 0x1e + lVar8] *
                 (double)local_78 +
                 local_358.m_data[uVar12 + lVar18 * 2 + local_358.m_rows * 0x17 + lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar14 % 2 != lVar8);
      }
      pdVar10 = local_338 + local_330 * 0x11;
      uVar12 = local_330;
      if ((((ulong)pdVar10 & 7) == 0) &&
         (uVar12 = (ulong)((uint)((ulong)pdVar10 >> 3) & 1), (long)local_330 <= (long)uVar12)) {
        uVar12 = local_330;
      }
      if (0 < (long)uVar12) {
        uVar15 = 0;
        do {
          pdVar10[uVar15] =
               local_358.m_data[local_358.m_rows * 0x33 + uVar15] * local_70[2] +
               local_358.m_data[local_358.m_rows * 0x32 + uVar15] * local_70[1] +
               local_358.m_data[local_358.m_rows * 0x31 + uVar15] * local_70[0] +
               local_358.m_data[local_358.m_rows * 0x30 + uVar15] * (double)local_78 +
               local_358.m_data[local_358.m_rows * 0x28 + uVar15];
          uVar15 = uVar15 + 1;
        } while (uVar12 != uVar15);
      }
      lVar14 = local_330 - uVar12;
      lVar8 = (lVar14 - (lVar14 >> 0x3f) & 0xfffffffffffffffeU) + uVar12;
      uVar15 = uVar12;
      if (1 < lVar14) {
        do {
          dVar1 = (local_358.m_data + local_358.m_rows * 0x28 + uVar15)[1];
          dVar2 = (local_358.m_data + local_358.m_rows * 0x30 + uVar15)[1];
          dVar3 = (local_358.m_data + local_358.m_rows * 0x31 + uVar15)[1];
          dVar4 = (local_358.m_data + local_358.m_rows * 0x32 + uVar15)[1];
          dVar5 = (local_358.m_data + local_358.m_rows * 0x33 + uVar15)[1];
          pdVar10[uVar15] =
               local_358.m_data[local_358.m_rows * 0x33 + uVar15] * local_70[2] +
               local_358.m_data[local_358.m_rows * 0x32 + uVar15] * local_70[1] +
               local_358.m_data[local_358.m_rows * 0x31 + uVar15] * local_70[0] +
               local_358.m_data[local_358.m_rows * 0x30 + uVar15] * (double)local_78 +
               local_358.m_data[local_358.m_rows * 0x28 + uVar15];
          (pdVar10 + uVar15)[1] =
               dVar5 * local_70[2] +
               dVar4 * local_70[1] + dVar3 * local_70[0] + dVar2 * (double)local_78 + dVar1;
          uVar15 = uVar15 + 2;
        } while ((long)uVar15 < lVar8);
      }
      if (lVar8 < (long)local_330) {
        lVar18 = lVar14 / 2;
        lVar8 = 0;
        do {
          local_338[uVar12 + lVar18 * 2 + local_330 * 0x11 + lVar8] =
               local_358.m_data[uVar12 + lVar18 * 2 + local_358.m_rows * 0x33 + lVar8] * local_70[2]
               + local_358.m_data[uVar12 + lVar18 * 2 + local_358.m_rows * 0x32 + lVar8] *
                 local_70[1] +
                 local_358.m_data[uVar12 + lVar18 * 2 + local_358.m_rows * 0x31 + lVar8] *
                 local_70[0] +
                 local_358.m_data[uVar12 + lVar18 * 2 + local_358.m_rows * 0x30 + lVar8] *
                 (double)local_78 +
                 local_358.m_data[uVar12 + lVar18 * 2 + local_358.m_rows * 0x28 + lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar14 % 2 != lVar8);
      }
      pdVar10 = local_338 + local_330 * 0x12;
      uVar12 = local_330;
      if ((((ulong)pdVar10 & 7) == 0) &&
         (uVar12 = (ulong)((uint)((ulong)pdVar10 >> 3) & 1), (long)local_330 <= (long)uVar12)) {
        uVar12 = local_330;
      }
      if (0 < (long)uVar12) {
        uVar15 = 0;
        do {
          pdVar10[uVar15] =
               local_358.m_data[local_358.m_rows * 0x26 + uVar15] * local_70[3] +
               local_358.m_data[local_358.m_rows * 0x25 + uVar15] * local_70[2] +
               local_358.m_data[local_358.m_rows * 0x24 + uVar15] * local_70[1] +
               local_358.m_data[local_358.m_rows * 0x23 + uVar15] * local_70[0] +
               local_358.m_data[local_358.m_rows * 0x22 + uVar15] * (double)local_78 +
               local_358.m_data[local_358.m_rows + uVar15];
          uVar15 = uVar15 + 1;
        } while (uVar12 != uVar15);
      }
      lVar14 = local_330 - uVar12;
      lVar8 = (lVar14 - (lVar14 >> 0x3f) & 0xfffffffffffffffeU) + uVar12;
      uVar15 = uVar12;
      if (1 < lVar14) {
        do {
          dVar1 = (local_358.m_data + local_358.m_rows + uVar15)[1];
          dVar2 = (local_358.m_data + local_358.m_rows * 0x22 + uVar15)[1];
          dVar3 = (local_358.m_data + local_358.m_rows * 0x23 + uVar15)[1];
          dVar4 = (local_358.m_data + local_358.m_rows * 0x24 + uVar15)[1];
          dVar5 = (local_358.m_data + local_358.m_rows * 0x25 + uVar15)[1];
          dVar6 = (local_358.m_data + local_358.m_rows * 0x26 + uVar15)[1];
          pdVar10[uVar15] =
               local_358.m_data[local_358.m_rows * 0x26 + uVar15] * local_70[3] +
               local_358.m_data[local_358.m_rows * 0x25 + uVar15] * local_70[2] +
               local_358.m_data[local_358.m_rows * 0x24 + uVar15] * local_70[1] +
               local_358.m_data[local_358.m_rows * 0x23 + uVar15] * local_70[0] +
               local_358.m_data[local_358.m_rows * 0x22 + uVar15] * (double)local_78 +
               local_358.m_data[local_358.m_rows + uVar15];
          (pdVar10 + uVar15)[1] =
               dVar6 * local_70[3] +
               dVar5 * local_70[2] +
               dVar4 * local_70[1] + dVar3 * local_70[0] + dVar2 * (double)local_78 + dVar1;
          uVar15 = uVar15 + 2;
        } while ((long)uVar15 < lVar8);
      }
      if (lVar8 < (long)local_330) {
        lVar8 = lVar14 / 2;
        lVar18 = 0;
        do {
          local_338[uVar12 + lVar8 * 2 + local_330 * 0x12 + lVar18] =
               local_358.m_data[uVar12 + lVar8 * 2 + local_358.m_rows * 0x26 + lVar18] * local_70[3]
               + local_358.m_data[uVar12 + lVar8 * 2 + local_358.m_rows * 0x25 + lVar18] *
                 local_70[2] +
                 local_358.m_data[uVar12 + lVar8 * 2 + local_358.m_rows * 0x24 + lVar18] *
                 local_70[1] +
                 local_358.m_data[uVar12 + lVar8 * 2 + local_358.m_rows * 0x23 + lVar18] *
                 local_70[0] +
                 local_358.m_data[uVar12 + lVar8 * 2 + local_358.m_rows * 0x22 + lVar18] *
                 (double)local_78 + local_358.m_data[local_358.m_rows + uVar12 + lVar8 * 2 + lVar18]
          ;
          lVar18 = lVar18 + 1;
        } while (lVar14 % 2 != lVar18);
      }
      pdVar10 = local_338 + local_330 * 0x13;
      uVar12 = local_330;
      if ((((ulong)pdVar10 & 7) == 0) &&
         (uVar12 = (ulong)((uint)((ulong)pdVar10 >> 3) & 1), (long)local_330 <= (long)uVar12)) {
        uVar12 = local_330;
      }
      local_270 = local_358.m_rows * 0x1b8;
      local_278 = local_358.m_rows * 0x1c0;
      if (0 < (long)uVar12) {
        uVar15 = 0;
        do {
          pdVar10[uVar15] =
               local_358.m_data[local_358.m_rows * 0x38 + uVar15] * local_70[3] +
               local_358.m_data[local_358.m_rows * 0x37 + uVar15] * local_70[2] +
               local_358.m_data[local_358.m_rows * 0x36 + uVar15] * local_70[1] +
               local_358.m_data[local_358.m_rows * 0x35 + uVar15] * local_70[0] +
               local_358.m_data[local_358.m_rows * 0x34 + uVar15] * (double)local_78 +
               local_358.m_data[local_358.m_rows * 0x27 + uVar15];
          uVar15 = uVar15 + 1;
        } while (uVar12 != uVar15);
      }
      lVar14 = local_330 - uVar12;
      lVar8 = uVar12 + (lVar14 - (lVar14 >> 0x3f) & 0xfffffffffffffffeU);
      uVar15 = uVar12;
      if (1 < lVar14) {
        do {
          dVar1 = (local_358.m_data + local_358.m_rows * 0x27 + uVar15)[1];
          dVar2 = (local_358.m_data + local_358.m_rows * 0x34 + uVar15)[1];
          dVar3 = (local_358.m_data + local_358.m_rows * 0x35 + uVar15)[1];
          dVar4 = (local_358.m_data + local_358.m_rows * 0x36 + uVar15)[1];
          dVar5 = (local_358.m_data + local_358.m_rows * 0x37 + uVar15)[1];
          dVar6 = (local_358.m_data + local_358.m_rows * 0x38 + uVar15)[1];
          pdVar10[uVar15] =
               local_358.m_data[local_358.m_rows * 0x38 + uVar15] * local_70[3] +
               local_358.m_data[local_358.m_rows * 0x37 + uVar15] * local_70[2] +
               local_358.m_data[local_358.m_rows * 0x36 + uVar15] * local_70[1] +
               local_358.m_data[local_358.m_rows * 0x35 + uVar15] * local_70[0] +
               local_358.m_data[local_358.m_rows * 0x34 + uVar15] * (double)local_78 +
               local_358.m_data[local_358.m_rows * 0x27 + uVar15];
          (pdVar10 + uVar15)[1] =
               dVar6 * local_70[3] +
               dVar5 * local_70[2] +
               dVar4 * local_70[1] + dVar3 * local_70[0] + dVar2 * (double)local_78 + dVar1;
          uVar15 = uVar15 + 2;
        } while ((long)uVar15 < lVar8);
      }
      if (lVar8 < (long)local_330) {
        lVar18 = lVar14 / 2;
        lVar8 = 0;
        do {
          local_338[uVar12 + lVar18 * 2 + local_330 * 0x13 + lVar8] =
               local_358.m_data[uVar12 + lVar18 * 2 + local_358.m_rows * 0x38 + lVar8] * local_70[3]
               + local_358.m_data[uVar12 + lVar18 * 2 + local_358.m_rows * 0x37 + lVar8] *
                 local_70[2] +
                 local_358.m_data[uVar12 + lVar18 * 2 + local_358.m_rows * 0x36 + lVar8] *
                 local_70[1] +
                 local_358.m_data[uVar12 + lVar18 * 2 + local_358.m_rows * 0x35 + lVar8] *
                 local_70[0] +
                 local_358.m_data[uVar12 + lVar18 * 2 + local_358.m_rows * 0x34 + lVar8] *
                 (double)local_78 +
                 local_358.m_data[uVar12 + lVar18 * 2 + local_358.m_rows * 0x27 + lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar14 % 2 != lVar8);
      }
      local_218._104_8_ = local_358.m_data + local_358.m_rows * 0x39;
      local_180 = local_358.m_data + local_358.m_rows * 0x3a;
      local_150 = local_358.m_data + local_358.m_rows * 0x3b;
      local_120 = local_358.m_data + local_358.m_rows * 0x3c;
      local_f0 = local_358.m_data + local_358.m_rows * 0x3d;
      local_c0 = local_358.m_data + local_358.m_rows * 0x3e;
      local_90 = local_358.m_data + local_358.m_rows * 0x3f;
      local_218._56_8_ = local_358.m_data;
      local_218._72_8_ = local_358.m_rows;
      local_218._88_8_ = local_78;
      local_218._120_8_ = local_358.m_rows;
      local_190 = local_70[0];
      local_170 = (void *)local_358.m_rows;
      local_160 = local_70[1];
      local_140 = (void *)local_358.m_rows;
      local_130 = local_70[2];
      local_110 = (void *)local_358.m_rows;
      local_100 = local_70[3];
      local_e0 = (void *)local_358.m_rows;
      local_d0 = local_70[4];
      local_b0 = (void *)local_358.m_rows;
      local_a0 = local_70[5];
      local_80 = (void *)local_358.m_rows;
      local_308.m_data = local_338 + local_330 * 0x14;
      local_308.m_rows = local_330;
      local_2e8 = 0;
      uStack_2e0 = 0x14;
      local_2d8 = local_330;
      local_220 = local_330;
      local_268.m_dst = (DstEvaluatorType *)local_230;
      local_268.m_functor = &local_319;
      local_2a8 = local_78;
      uStack_2a0 = 0;
      local_298 = local_70[0];
      uStack_290 = 0;
      local_2c8 = local_70[1];
      uStack_2c0 = 0;
      local_2b8 = local_70[2];
      uStack_2b0 = 0;
      local_318 = local_70[3];
      uStack_310 = 0;
      local_2f0 = (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_338;
      local_268.m_src = (SrcEvaluatorType *)local_218;
      local_268.m_dstExpr = (DstXprType *)&local_308;
      local_230._0_8_ = local_308.m_data;
      Eigen::internal::dense_assignment_loop<$b2a47d00$>::run(&local_268);
      pdVar10 = local_338;
      *local_338 = *local_338 - (double)local_2a8;
      local_338[local_330 + 1] = local_338[local_330 + 1] - (double)local_2a8;
      local_338[local_330 * 2 + 3] = local_338[local_330 * 2 + 3] - (double)local_2a8;
      local_338[local_330 * 3 + 6] = local_338[local_330 * 3 + 6] - (double)local_2a8;
      local_338[local_330 * 4 + 10] = local_338[local_330 * 4 + 10] - (double)local_2a8;
      local_338[local_330 * 5 + 0xf] = local_338[local_330 * 5 + 0xf] - (double)local_2a8;
      local_338[local_330 * 6 + 2] = local_338[local_330 * 6 + 2] - local_298;
      local_338[local_330 * 7 + 4] = local_338[local_330 * 7 + 4] - local_298;
      local_338[local_330 * 8 + 7] = local_338[local_330 * 8 + 7] - local_298;
      local_338[local_330 * 9 + 0xb] = local_338[local_330 * 9 + 0xb] - local_298;
      local_338[local_330 * 10 + 0x10] = local_338[local_330 * 10 + 0x10] - local_298;
      local_338[local_330 * 0xb + 5] = local_338[local_330 * 0xb + 5] - local_2c8;
      local_338[local_330 * 0xc + 8] = local_338[local_330 * 0xc + 8] - local_2c8;
      local_338[local_330 * 0xd + 0xc] = local_338[local_330 * 0xd + 0xc] - local_2c8;
      local_338[local_330 * 0xe + 0x11] = local_338[local_330 * 0xe + 0x11] - local_2b8;
      local_338[local_330 * 0xf + 9] = local_338[local_330 * 0xf + 9] - local_318;
      local_338[local_330 * 0x10 + 0xd] = local_338[local_330 * 0x10 + 0xd] - local_318;
      local_338[local_330 * 0x11 + 0x12] = local_338[local_330 * 0x11 + 0x12] - local_318;
      local_338[local_330 * 0x12 + 0xe] = local_338[local_330 * 0x12 + 0xe] - dVar7;
      local_338[local_330 * 0x13 + 0x13] = local_338[local_330 * 0x13 + 0x13] - dVar7;
      local_338[local_330 * 0x14 + 0x14] = local_338[local_330 * 0x14 + 0x14] - local_70[6];
      local_308.m_data = (double *)0x0;
      local_308.m_rows = 0;
      local_308.m_cols = 0;
      if (0x666666666666666 < (long)local_330) {
        puVar9 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar9 = std::ostream::_M_insert<long>;
        __cxa_throw(puVar9,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_308,local_330 * 0x14,local_330,0x14)
      ;
      lVar8 = local_308.m_cols * local_308.m_rows;
      uVar12 = lVar8 - (lVar8 >> 0x3f) & 0xfffffffffffffffe;
      if (1 < lVar8) {
        lVar14 = 0;
        do {
          pdVar11 = pdVar10 + lVar14;
          dVar7 = pdVar11[1];
          local_308.m_data[lVar14] = *pdVar11;
          (local_308.m_data + lVar14)[1] = dVar7;
          lVar14 = lVar14 + 2;
        } while (lVar14 < (long)uVar12);
      }
      if ((long)uVar12 < lVar8) {
        do {
          local_308.m_data[uVar12] = pdVar10[uVar12];
          uVar12 = uVar12 + 1;
        } while (lVar8 - uVar12 != 0);
      }
      Eigen::ColPivHouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                ((ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_218,
                 (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_308);
      free(local_308.m_data);
      __return_storage_ptr__ =
           (vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)local_280;
      local_308.m_data = local_338 + local_330 * 0x14;
      local_308.m_rows = local_330;
      local_2e8 = 0;
      uStack_2e0 = 0x14;
      local_2d8 = local_330;
      local_268.m_dst = (DstEvaluatorType *)0x0;
      local_268.m_src = (SrcEvaluatorType *)0x0;
      local_2f0 = (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_338;
      local_230._0_8_ = (ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_218;
      local_230._8_8_ = &local_308;
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_268,
                 local_218._16_8_,1);
      Eigen::internal::
      Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
      ::run((Matrix<double,__1,_1,_0,__1,_1> *)&local_268,(SrcXprType *)local_230,&local_319);
      free((void *)local_218._104_8_);
      free((void *)local_218._88_8_);
      free((void *)local_218._72_8_);
      free((void *)local_218._56_8_);
      free((void *)local_218._40_8_);
      free((void *)local_218._24_8_);
      free((void *)local_218._0_8_);
      local_218._0_8_ =
           local_268.m_dst[6].
           super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
           .m_data;
      local_218._8_8_ =
           *(undefined8 *)
            &local_268.m_dst[6].
             super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
             super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
             .field_0x8;
      local_218._16_8_ = local_78;
      __position._M_current = *(Matrix<double,_3,_1,_0,_3,_1> **)((long)__return_storage_ptr__ + 8);
      if (__position._M_current ==
          *(Matrix<double,_3,_1,_0,_3,_1> **)((long)__return_storage_ptr__ + 0x10)) {
        std::vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>
        ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>>
                  ((vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                    *)__return_storage_ptr__,__position,(Matrix<double,_3,_1,_0,_3,_1> *)local_218);
      }
      else {
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
        m_storage.m_data.array[2] = (double)local_78;
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
        m_storage.m_data.array[0] = (double)local_218._0_8_;
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
        m_storage.m_data.array[1] = (double)local_218._8_8_;
        *(long *)((long)__return_storage_ptr__ + 8) =
             *(long *)((long)__return_storage_ptr__ + 8) + 0x18;
      }
      free(local_268.m_dst);
      free(local_338);
      uVar12 = local_238 + 1;
    } while (uVar12 != local_248);
  }
  free(local_358.m_data);
  return (vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          *)(vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>
             *)__return_storage_ptr__;
}

Assistant:

std::vector<Eigen::Vector3d> solve_xy_from_AM(double * z, int nroots, Eigen::MatrixXd AM) {
	int ind[] = { 5, 6, 7, 9, 10, 12, 15, 16, 18, 22, 26, 27, 29, 33, 38, 43, 44, 47, 51, 56, 63 };
	Eigen::MatrixXd AMs(21, 64);
	double zi[8];
	std::vector<Eigen::Vector3d> sols;
	for (int i = 0; i < 21; i++)
	{
		AMs.row(i) = AM.row(ind[i]);
	}
	for (int i = 0; i < nroots; i++)
	{
		zi[0] = z[i];
		for (int j = 1; j < 8; j++)
		{
			zi[j] = zi[j - 1] * z[i];
		}
		Eigen::MatrixXd AA = Eigen::MatrixXd::Zero(21, 21);
		AA.col(0) = AMs.col(5);
		AA.col(1) = AMs.col(6);
		AA.col(2) = AMs.col(9);
		AA.col(3) = AMs.col(15);
		AA.col(4) = AMs.col(26);
		AA.col(5) = AMs.col(43);
		AA.col(6) = AMs.col(4) + zi[0] * AMs.col(7);
		AA.col(7) = AMs.col(8) + zi[0] * AMs.col(10);
		AA.col(8) = AMs.col(14) + zi[0] * AMs.col(16);
		AA.col(9) = AMs.col(25) + zi[0] * AMs.col(27);
		AA.col(10) = AMs.col(42) + zi[0] * AMs.col(44);
		AA.col(11) = AMs.col(3) + zi[0] * AMs.col(11) + zi[1] * AMs.col(12);
		AA.col(12) = AMs.col(13) + zi[0] * AMs.col(17) + zi[1] * AMs.col(18);
		AA.col(13) = AMs.col(24) + zi[0] * AMs.col(28) + zi[1] * AMs.col(29);
		AA.col(14) = AMs.col(41) + zi[0] * AMs.col(45) + zi[1] * AMs.col(46) + zi[2] * AMs.col(47);
		AA.col(15) = AMs.col(2) + zi[0] * AMs.col(19) + zi[1] * AMs.col(20) + zi[2] * AMs.col(21) + zi[3] * AMs.col(22);
		AA.col(16) = AMs.col(23) + zi[0] * AMs.col(30) + zi[1] * AMs.col(31) + zi[2] * AMs.col(32) + zi[3] * AMs.col(33);
		AA.col(17) = AMs.col(40) + zi[0] * AMs.col(48) + zi[1] * AMs.col(49) + zi[2] * AMs.col(50) + zi[3] * AMs.col(51);
		AA.col(18) = AMs.col(1) + zi[0] * AMs.col(34) + zi[1] * AMs.col(35) + zi[2] * AMs.col(36) + zi[3] * AMs.col(37) + zi[4] * AMs.col(38);
		AA.col(19) = AMs.col(39) + zi[0] * AMs.col(52) + zi[1] * AMs.col(53) + zi[2] * AMs.col(54) + zi[3] * AMs.col(55) + zi[4] * AMs.col(56);
		AA.col(20) = AMs.col(0) + zi[0] * AMs.col(57) + zi[1] * AMs.col(58) + zi[2] * AMs.col(59) + zi[3] * AMs.col(60) + zi[4] * AMs.col(61) + zi[5] * AMs.col(62) + zi[6] * AMs.col(63);
		AA(0, 0) = AA(0, 0) - zi[0];
		AA(1, 1) = AA(1, 1) - zi[0];
		AA(3, 2) = AA(3, 2) - zi[0];
		AA(6, 3) = AA(6, 3) - zi[0];
		AA(10, 4) = AA(10, 4) - zi[0];
		AA(15, 5) = AA(15, 5) - zi[0];
		AA(2, 6) = AA(2, 6) - zi[1];
		AA(4, 7) = AA(4, 7) - zi[1];
		AA(7, 8) = AA(7, 8) - zi[1];
		AA(11, 9) = AA(11, 9) - zi[1];
		AA(16, 10) = AA(16, 10) - zi[1];
		AA(5, 11) = AA(5, 11) - zi[2];
		AA(8, 12) = AA(8, 12) - zi[2];
		AA(12, 13) = AA(12, 13) - zi[2];
		AA(17, 14) = AA(17, 14) - zi[3];
		AA(9, 15) = AA(9, 15) - zi[4];
		AA(13, 16) = AA(13, 16) - zi[4];
		AA(18, 17) = AA(18, 17) - zi[4];
		AA(14, 18) = AA(14, 18) - zi[5];
		AA(19, 19) = AA(19, 19) - zi[5];
		AA(20, 20) = AA(20, 20) - zi[7];
		Eigen::VectorXd s = AA.leftCols(20).colPivHouseholderQr().solve(-AA.col(20));
		sols.push_back(Eigen::Vector3d(s(18), s(19), zi[0]));
	}

	return sols;
}